

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ns.c
# Opt level: O0

void makect(size_t nc,size_t *ip,float *c)

{
  ulong uVar1;
  float fVar2;
  float fVar3;
  float local_5c;
  float local_50;
  float delta;
  size_t nch;
  size_t j;
  float *c_local;
  size_t *ip_local;
  size_t nc_local;
  
  ip[1] = nc;
  if (1 < nc) {
    uVar1 = nc >> 1;
    fVar2 = atanf(1.0);
    fVar2 = fVar2 / (float)uVar1;
    fVar3 = cosf(fVar2 * (float)uVar1);
    *c = fVar3;
    c[uVar1] = *c * 0.5;
    for (nch = 1; nch < uVar1; nch = nch + 1) {
      local_50 = (float)nch;
      fVar3 = cosf(fVar2 * local_50);
      c[nch] = fVar3 * 0.5;
      local_5c = (float)nch;
      fVar3 = sinf(fVar2 * local_5c);
      c[nc - nch] = fVar3 * 0.5;
    }
  }
  return;
}

Assistant:

static void makect(size_t nc, size_t *ip, float *c) {
    size_t j, nch;
    float delta;

    ip[1] = nc;
    if (nc > 1) {
        nch = nc >> 1;
        delta = atanf(1.0f) / nch;
        c[0] = cosf(delta * nch);
        c[nch] = 0.5f * c[0];
        for (j = 1; j < nch; j++) {
            c[j] = 0.5f * cosf(delta * j);
            c[nc - j] = 0.5f * sinf(delta * j);
        }
    }
}